

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdGetPsbtBip32Data(void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey,
                       char **fingerprint,char **bip32_path)

{
  pointer *ppuVar1;
  pointer pKVar2;
  bool bVar3;
  bool bVar4;
  CfdException *pCVar5;
  pointer this;
  char *work_path;
  char *work_fingerprint;
  Pubkey target_pubkey;
  KeyData key;
  KeyData pk_obj;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_448;
  void *local_430;
  char *local_428;
  char *local_420;
  int local_414;
  char **local_410;
  undefined1 local_408 [16];
  undefined1 local_3f8 [72];
  pointer local_3b0;
  ByteData local_390;
  Pubkey local_378;
  ExtPubkey local_360;
  ByteData local_2f0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [32];
  pointer local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0 [24];
  pointer local_288;
  pointer puStack_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_260 [24];
  pointer local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228 [24];
  pointer local_210;
  pointer puStack_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_200 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d0 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> avStack_1a0 [32];
  KeyData local_180;
  
  local_420 = (char *)0x0;
  local_428 = (char *)0x0;
  local_430 = handle;
  local_414 = kind;
  local_410 = fingerprint;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10
            );
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_180);
  if ((pointer *)
      local_180.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pubkey == (char *)0x0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x684;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"pubkey is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to parameter. pubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_180);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x68a;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"psbt is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&local_180);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ParsePubkey(&local_180,kind,pubkey,*(NetType *)((long)psbt_handle + 0x10));
  local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (kind == 4) {
    cfd::core::Psbt::GetGlobalXpubkeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_408,
               *(Psbt **)((long)psbt_handle + 0x18));
  }
  else if (kind == 3) {
    cfd::core::Psbt::GetTxOutKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_408,
               *(Psbt **)((long)psbt_handle + 0x18),index);
  }
  else {
    if (kind != 2) {
      local_2d8._0_8_ = "cfdcapi_psbt.cpp";
      local_2d8._8_4_ = 0x699;
      local_2c8._0_8_ = "CfdGetPsbtBip32Data";
      cfd::core::logger::log<int&>
                ((CfdSourceLocation *)local_2d8,kCfdLogLevelWarning,"kind is invalid: {}",&local_414
                );
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_2d8._0_8_ = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,"Failed to parameter. kind is invalid.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_2d8);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Psbt::GetTxInKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_408,
               *(Psbt **)((long)psbt_handle + 0x18),index);
  }
  local_2c8._0_8_ =
       local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_2d8._8_8_ =
       local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_2d8._0_8_ =
       local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_3f8._0_8_;
  local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_408._0_8_;
  local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_408._8_8_;
  local_408._0_8_ = (pointer)0x0;
  local_408._8_8_ = (pointer)0x0;
  local_3f8._0_8_ = (pointer)0x0;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_2d8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_408);
  cfd::core::KeyData::KeyData((KeyData *)local_2d8);
  bVar3 = cfd::core::KeyData::HasExtPubkey(&local_180);
  cfd::core::KeyData::GetPubkey(&local_378,&local_180);
  pKVar2 = local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = local_448.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::KeyData::GetPubkey((Pubkey *)local_408,this);
      bVar4 = cfd::core::Pubkey::Equals((Pubkey *)local_408,&local_378);
      if ((pointer)local_408._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_408._0_8_);
      }
      if (bVar4) {
        if (bVar3) {
          cfd::core::KeyData::GetExtPubkey((ExtPubkey *)local_408,this);
          cfd::core::ExtPubkey::GetData(&local_390,(ExtPubkey *)local_408);
          cfd::core::KeyData::GetExtPubkey(&local_360,&local_180);
          cfd::core::ExtPubkey::GetData(&local_2f0,&local_360);
          bVar4 = cfd::core::ByteData::Equals(&local_390,&local_2f0);
          if (local_2f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2f0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_360.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_360.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_360.chaincode_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.chaincode_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_360.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.serialize_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_390.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_390.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_3b0 != (pointer)0x0) {
            operator_delete(local_3b0);
          }
          if ((pointer)local_3f8._48_8_ != (pointer)0x0) {
            operator_delete((void *)local_3f8._48_8_);
          }
          if ((pointer)local_3f8._24_8_ != (pointer)0x0) {
            operator_delete((void *)local_3f8._24_8_);
          }
          if ((pointer)local_408._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_408._0_8_);
          }
          if (!bVar4) goto LAB_0041a2a8;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2d8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_2c8 + 8),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->privkey_);
        local_2a8 = *(pointer *)&(this->privkey_).is_compressed_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_2a0,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_);
        local_288 = *(pointer *)&(this->extprivkey_).version_;
        puStack_280 = *(pointer *)&(this->extprivkey_).depth_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_278,&(this->extprivkey_).chaincode_.data_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_260,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &(this->extprivkey_).privkey_);
        local_248 = *(pointer *)&(this->extprivkey_).privkey_.is_compressed_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_240,&(this->extprivkey_).tweak_sum_.data_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_228,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_);
        local_210 = *(pointer *)&(this->extpubkey_).version_;
        puStack_208 = *(pointer *)&(this->extpubkey_).depth_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_200,&(this->extpubkey_).chaincode_.data_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_1e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &(this->extpubkey_).pubkey_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_1d0,&(this->extpubkey_).tweak_sum_.data_);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&local_1b8,&this->path_)
        ;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (avStack_1a0,&(this->fingerprint_).data_);
        break;
      }
LAB_0041a2a8:
      this = this + 1;
    } while (this != pKVar2);
  }
  bVar3 = cfd::core::KeyData::IsValid((KeyData *)local_2d8);
  if (!bVar3) {
    local_360.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_360.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x6b1;
    local_360.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
    cfd::core::KeyData::ToString_abi_cxx11_((string *)local_408,&local_180,true,kApostrophe,false);
    cfd::core::logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)&local_360,kCfdLogLevelWarning,"pubkey not found: {}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
    if ((pointer)local_408._0_8_ != (pointer)local_3f8) {
      operator_delete((void *)local_408._0_8_);
    }
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_408._0_8_ = (pointer)local_3f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408,"Failed to parameter. pubkey not found","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_408);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_410 != (char **)0x0) {
    cfd::core::KeyData::GetFingerprint(&local_360.serialize_data_,(KeyData *)local_2d8);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_408,&local_360.serialize_data_);
    local_420 = cfd::capi::CreateString((string *)local_408);
    if ((pointer)local_408._0_8_ != (pointer)local_3f8) {
      operator_delete((void *)local_408._0_8_);
    }
    if (local_360.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_360.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (bip32_path != (char **)0x0) {
    cfd::core::KeyData::GetBip32Path_abi_cxx11_
              ((string *)local_408,(KeyData *)local_2d8,kApostrophe,false);
    local_428 = cfd::capi::CreateString((string *)local_408);
    if ((pointer)local_408._0_8_ != (pointer)local_3f8) {
      operator_delete((void *)local_408._0_8_);
    }
  }
  if (local_410 != (char **)0x0) {
    *local_410 = local_420;
  }
  if (bip32_path != (char **)0x0) {
    *bip32_path = local_428;
  }
  if (local_378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::KeyData::~KeyData((KeyData *)local_2d8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_448);
  cfd::core::KeyData::~KeyData(&local_180);
  return 0;
}

Assistant:

int CfdGetPsbtBip32Data(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey, char** fingerprint, char** bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_fingerprint = nullptr;
  char* work_path = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);

    std::vector<KeyData> key_list;
    if (kind == kCfdPsbtRecordInputBip32) {
      key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
    } else if (kind == kCfdPsbtRecordOutputBip32) {
      key_list = psbt_obj->psbt->GetTxOutKeyDataList(index);
    } else if (kind == kCfdPsbtRecordGloalXpub) {
      key_list = psbt_obj->psbt->GetGlobalXpubkeyDataList();
    } else {
      warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. kind is invalid.");
    }

    KeyData key;
    bool has_extpubkey = pk_obj.HasExtPubkey();
    Pubkey target_pubkey = pk_obj.GetPubkey();
    for (const auto& temp_key : key_list) {
      if (temp_key.GetPubkey().Equals(target_pubkey)) {
        if (has_extpubkey) {
          if (temp_key.GetExtPubkey().GetData().Equals(
                  pk_obj.GetExtPubkey().GetData())) {
            key = temp_key;
            break;
          }
        } else {
          key = temp_key;
          break;
        }
      }
    }
    if (!key.IsValid()) {
      warn(CFD_LOG_SOURCE, "pubkey not found: {}", pk_obj.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey not found");
    }

    if (fingerprint != nullptr) {
      work_fingerprint = CreateString(key.GetFingerprint().GetHex());
    }
    if (bip32_path != nullptr) work_path = CreateString(key.GetBip32Path());

    if (fingerprint != nullptr) *fingerprint = work_fingerprint;
    if (bip32_path != nullptr) *bip32_path = work_path;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_fingerprint, &work_path);
  return result;
}